

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall
helics::apps::Connector::Connector
          (Connector *this,string_view appName,CoreApp *coreObj,FederateInfo *fedInfo)

{
  string_view appName_00;
  bool bVar1;
  element_type *peVar2;
  char *in_RDX;
  size_t in_RSI;
  undefined8 *in_RDI;
  shared_ptr<helics::Core> *in_stack_ffffffffffffff68;
  shared_ptr<helics::Core> *in_stack_ffffffffffffff70;
  Connector *this_00;
  shared_ptr<helics::Core> *in_stack_ffffffffffffff88;
  CoreApp *in_stack_ffffffffffffff90;
  bool local_56;
  FederateInfo *in_stack_ffffffffffffffb0;
  CoreApp *in_stack_ffffffffffffffb8;
  App *in_stack_ffffffffffffffc0;
  
  appName_00._M_str = in_RDX;
  appName_00._M_len = in_RSI;
  App::App(in_stack_ffffffffffffffc0,appName_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0)
  ;
  *in_RDI = &PTR__Connector_0094d8a8;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 1));
  if (bVar1) {
    peVar2 = CLI::std::
             __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1ee7d1);
    in_stack_ffffffffffffff90 =
         (CoreApp *)
         Federate::getCorePointer
                   ((Federate *)
                    ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
                    (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]));
    CLI::std::shared_ptr<helics::Core>::shared_ptr
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    CLI::std::shared_ptr<helics::Core>::shared_ptr
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  CoreApp::CoreApp(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (bVar1) {
    std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x1ee84a);
  }
  else {
    std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x1ee837);
  }
  CLI::std::
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
  ::unordered_multimap
            ((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
              *)0x1ee85f);
  this_00 = (Connector *)(in_RDI + 0x21);
  CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::vector
            ((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *)0x1ee875
            );
  CLI::std::
  vector<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
  ::vector((vector<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
            *)0x1ee88b);
  CLI::std::
  unordered_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x1ee8a1);
  CLI::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x1ee8b7);
  in_RDI[0x35] = 0;
  in_RDI[0x36] = 0;
  *(undefined1 *)(in_RDI + 0x37) = 0;
  *(undefined1 *)((long)in_RDI + 0x1b9) = 0;
  *(undefined1 *)((long)in_RDI + 0x1ba) = 0;
  initialSetup(this_00);
  return;
}

Assistant:

Connector::Connector(std::string_view appName, CoreApp& coreObj, const FederateInfo& fedInfo):
    App(appName, coreObj, fedInfo), core((fed) ? fed->getCorePointer() : nullptr)
{
    initialSetup();
}